

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::dynamicCubemap
               (function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                *_renderFnc,string *_file,vec3 _pos,int _viewSize)

{
  undefined4 _width;
  undefined4 _height;
  int iVar1;
  ostream *poVar2;
  uchar *_pixels;
  socklen_t in_ECX;
  int _viewSize_00;
  undefined4 in_register_00000014;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  string *psVar3;
  function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> local_50;
  
  __addr = (sockaddr *)CONCAT44(in_register_00000014,_viewSize);
  if (((cubemapFbo[0x30] != '\x01') || (cubemapFbo._40_4_ != _viewSize)) ||
     (psVar3 = _file, cubemapFbo._44_4_ != _viewSize)) {
    psVar3 = (string *)(ulong)(uint)(_viewSize * 4);
    in_ECX = 1;
    Fbo::allocate((Fbo *)cubemapFbo,_viewSize * 4,_viewSize * 3,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,
                  REPEAT,true);
    __addr = extraout_RDX;
  }
  Fbo::bind((Fbo *)cubemapFbo,(int)psVar3,__addr,in_ECX);
  std::function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>::function
            (&local_50,_renderFnc);
  dynamicCubemap((vera *)&local_50,
                 (function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *)
                 (ulong)(uint)_viewSize,_pos,_viewSize_00);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  Fbo::unbind((Fbo *)cubemapFbo);
  glBindFramebuffer(0x8d40,cubemapFbo._20_4_);
  _height = cubemapFbo._44_4_;
  _width = cubemapFbo._40_4_;
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,cubemapFbo._40_4_);
  poVar2 = std::operator<<(poVar2,"x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_height);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = -1;
  if (-1 < (int)(_height * _width)) {
    iVar1 = _height * _width * 4;
  }
  _pixels = (uchar *)operator_new__((long)iVar1);
  glReadPixels(0,0,_width,_height,0x1908,0x1401,_pixels);
  savePixels(_file,_pixels,_width,_height);
  operator_delete__(_pixels);
  glBindFramebuffer(0x8d40,0);
  return;
}

Assistant:

void dynamicCubemap(std::function<void(Camera&, glm::vec4&, int&)> _renderFnc, const std::string& _file, glm::vec3 _pos, int _viewSize) {
    if (!cubemapFbo.isAllocated() || cubemapFbo.getWidth() != _viewSize || cubemapFbo.getHeight() != _viewSize)
        cubemapFbo.allocate(_viewSize * 4, _viewSize * 3, COLOR_TEXTURE_DEPTH_BUFFER);

    cubemapFbo.bind();

    dynamicCubemap(_renderFnc, _pos, _viewSize);

    cubemapFbo.unbind();

    glBindFramebuffer(GL_FRAMEBUFFER, cubemapFbo.getId());
    int width = cubemapFbo.getWidth();
    int height = cubemapFbo.getHeight();
    std::cout << width << "x" << height << std::endl;

    unsigned char* pixels = new unsigned char[width * height*4];
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
    savePixels(_file, pixels, width, height);
    delete[] pixels;
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
}